

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_get_inplace_descriptor(AMQP_VALUE value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  char *pcVar3;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "NULL value";
    iVar2 = 0x1bf5;
  }
  else {
    if ((value->type & ~AMQP_TYPE_NULL) == AMQP_TYPE_DESCRIBED) {
      return (value->value).described_value.descriptor;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar3 = "Type is not described or composite";
    iVar2 = 0x1bfe;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_get_inplace_descriptor",iVar2,1,pcVar3);
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_get_inplace_descriptor(AMQP_VALUE value)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if ((value_data->type != AMQP_TYPE_DESCRIBED) &&
            (value_data->type != AMQP_TYPE_COMPOSITE))
        {
            LogError("Type is not described or composite");
            result = NULL;
        }
        else
        {
            result = value_data->value.described_value.descriptor;
        }
    }

    return result;
}